

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hudmessages.cpp
# Opt level: O0

bool __thiscall DHUDMessageFadeOut::Tick(DHUDMessageFadeOut *this)

{
  DHUDMessageFadeOut *this_local;
  
  (this->super_DHUDMessage).Tics = (this->super_DHUDMessage).Tics + 1;
  if (((this->super_DHUDMessage).State == 1) &&
     ((this->super_DHUDMessage).HoldTics <= (this->super_DHUDMessage).Tics)) {
    (this->super_DHUDMessage).State = (this->super_DHUDMessage).State + 1;
    (this->super_DHUDMessage).Tics =
         (this->super_DHUDMessage).Tics - (this->super_DHUDMessage).HoldTics;
  }
  if (((this->super_DHUDMessage).State == 2) &&
     (this->FadeOutTics <= (this->super_DHUDMessage).Tics)) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool DHUDMessageFadeOut::Tick ()
{
	Tics++;
	if (State == 1 && HoldTics <= Tics)
	{
		State++;
		Tics -= HoldTics;
	}
	if (State == 2 && FadeOutTics <= Tics)
	{
		return true;
	}
	return false;
}